

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UniquenessConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UniquenessConstraintSyntax,slang::parsing::Token&,slang::syntax::RangeListSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,RangeListSyntax *args_1,Token *args_2)

{
  Token semi;
  Token unique;
  UniquenessConstraintSyntax *pUVar1;
  Info *in_RCX;
  undefined8 in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pUVar1 = (UniquenessConstraintSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  unique.info = in_RSI;
  unique.kind = (short)in_RDX;
  unique._2_1_ = (char)((ulong)in_RDX >> 0x10);
  unique.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  unique.rawLen = (int)((ulong)in_RDX >> 0x20);
  semi.info = in_RCX;
  semi._0_8_ = in_RSI->location;
  slang::syntax::UniquenessConstraintSyntax::UniquenessConstraintSyntax
            ((UniquenessConstraintSyntax *)in_RSI->rawTextPtr,unique,
             (RangeListSyntax *)in_RCX->location,semi);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }